

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opener_file_system.hpp
# Opt level: O0

string * __thiscall duckdb::OpenerFileSystem::GetName_abi_cxx11_(OpenerFileSystem *this)

{
  long *plVar1;
  long *in_RSI;
  string *in_RDI;
  string *__rhs;
  string *__lhs;
  string local_30 [48];
  
  __rhs = in_RDI;
  plVar1 = (long *)(**(code **)(*in_RSI + 0x160))();
  __lhs = local_30;
  (**(code **)(*plVar1 + 0x140))();
  ::std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  ::std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string GetName() const override {
		return "OpenerFileSystem - " + GetFileSystem().GetName();
	}